

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O0

void y_number_suite::y_number_real_capital_e_pos_exp(void)

{
  undefined4 local_1c0;
  value local_1bc [2];
  undefined4 local_1b4;
  value local_1b0 [2];
  view_type local_1a8;
  undefined4 local_190;
  value local_18c [6];
  undefined4 local_174;
  value local_170 [2];
  basic_string_view<char,_std::char_traits<char>_> local_168;
  undefined1 local_158 [8];
  reader reader;
  char input [7];
  
  reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_3_ = 0x5d32;
  reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x2b45315b;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_168,
             (char *)&reader.stack.c.
                      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  trial::protocol::json::basic_reader<char>::basic_reader
            ((basic_reader<char> *)local_158,&local_168);
  local_170[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_174 = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xbe6,"void y_number_suite::y_number_real_capital_e_pos_exp()",local_170,&local_174);
  trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_158);
  local_18c[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_190 = 9;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::real",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xbe8,"void y_number_suite::y_number_real_capital_e_pos_exp()",local_18c,&local_190);
  local_1a8 = trial::protocol::json::basic_reader<char>::literal((basic_reader<char> *)local_158);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[5]>
            ("reader.literal()","\"1E+2\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xbe9,"void y_number_suite::y_number_real_capital_e_pos_exp()",&local_1a8,"1E+2");
  trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_158);
  local_1b0[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_1b4 = 0xd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xbeb,"void y_number_suite::y_number_real_capital_e_pos_exp()",local_1b0,&local_1b4);
  trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_158);
  local_1bc[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_1c0 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xbed,"void y_number_suite::y_number_real_capital_e_pos_exp()",local_1bc,&local_1c0);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_158);
  return;
}

Assistant:

void y_number_real_capital_e_pos_exp()
{
    const char input[] = "[1E+2]";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::real);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "1E+2");
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}